

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O0

void __thiscall Omega_h::Adj::Adj(Adj *this,LOs *ab2b_,Read<signed_char> *codes_)

{
  Read<int> local_30;
  Read<signed_char> *local_20;
  Read<signed_char> *codes__local;
  LOs *ab2b__local;
  Adj *this_local;
  
  local_20 = codes_;
  codes__local = (Read<signed_char> *)ab2b_;
  ab2b__local = (LOs *)this;
  Read<int>::Read(&local_30,ab2b_);
  Graph::Graph(&this->super_Graph,&local_30);
  Read<int>::~Read(&local_30);
  Read<signed_char>::Read(&this->codes,codes_);
  return;
}

Assistant:

Adj(LOs ab2b_, Read<I8> codes_) : Graph(ab2b_), codes(codes_) {}